

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall MPLSParser::composePlayList(MPLSParser *this,BitStreamWriter *writer)

{
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  *pmtIndexList;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  int iVar7;
  uint32_t uVar8;
  MPLSStreamInfo *pMVar9;
  int iVar10;
  int iVar11;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t subPathNum;
  size_t extraout_RDX_01;
  ulong uVar12;
  int iVar13;
  size_t playItemNum;
  int local_60;
  
  puVar3 = (writer->super_BitStream).m_buffer;
  puVar4 = (writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited;
  uVar12 = 0;
  BitStreamWriter::putBits(writer,0x20,0);
  puVar5 = (writer->super_BitStream).m_buffer;
  puVar6 = (writer->super_BitStream).m_initBuffer;
  uVar2 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x10,0);
  pMVar9 = getMainStream(this);
  pmtIndexList = &(pMVar9->super_M2TSStreamInfo).m_index;
  BitStreamWriter::putBits
            (writer,0x10,
             (int)((ulong)((long)(pMVar9->super_M2TSStreamInfo).m_index.
                                 super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pMVar9->super_M2TSStreamInfo).m_index.
                                super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555);
  BitStreamWriter::putBits(writer,0x10,this->number_of_SubPaths);
  subPathNum = extraout_RDX;
  if ((pMVar9->super_M2TSStreamInfo).m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pMVar9->super_M2TSStreamInfo).m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    playItemNum = 0;
    do {
      composePlayItem(this,writer,playItemNum,pmtIndexList);
      playItemNum = playItemNum + 1;
      uVar12 = ((long)(pMVar9->super_M2TSStreamInfo).m_index.
                      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pMVar9->super_M2TSStreamInfo).m_index.
                      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      subPathNum = extraout_RDX_00;
    } while (playItemNum < uVar12);
  }
  if ((long)this->number_of_SubPaths * uVar12 != 0) {
    uVar12 = 0;
    do {
      composeSubPath(this,writer,subPathNum,pmtIndexList,this->subPath_type);
      uVar12 = uVar12 + 1;
      subPathNum = extraout_RDX_01;
    } while (uVar12 < (ulong)((long)this->number_of_SubPaths * -0x5555555555555555 *
                             ((long)(pMVar9->super_M2TSStreamInfo).m_index.
                                    super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pMVar9->super_M2TSStreamInfo).m_index.
                                    super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4)));
  }
  local_60 = (int)puVar6;
  local_60 = (int)puVar5 - local_60;
  iVar7 = uVar2 + local_60 * 8;
  iVar13 = (int)puVar3 - (int)puVar4;
  iVar10 = uVar1 + iVar13 * 8;
  iVar11 = uVar2 + local_60 * 8 + 7;
  if (-1 < iVar7) {
    iVar11 = iVar7;
  }
  iVar7 = uVar1 + iVar13 * 8 + 7;
  if (-1 < iVar10) {
    iVar7 = iVar10;
  }
  iVar13 = *(int *)&(writer->super_BitStream).m_buffer -
           *(int *)&(writer->super_BitStream).m_initBuffer;
  iVar10 = writer->m_bitWrited + iVar13 * 8;
  iVar13 = writer->m_bitWrited + iVar13 * 8 + 7;
  if (-1 < iVar10) {
    iVar13 = iVar10;
  }
  uVar8 = my_ntohl((iVar13 >> 3) - (iVar11 >> 3));
  *(uint32_t *)((long)puVar4 + (long)(iVar7 >> 3)) = uVar8;
  return;
}

Assistant:

void MPLSParser::composePlayList(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;
    writer.putBits(16, 0);  // reserved_for_future_use
    const MPLSStreamInfo& mainStreamInfo = getMainStream();
    writer.putBits(16, static_cast<unsigned>(mainStreamInfo.m_index.size()));  // number_of_PlayItems
    writer.putBits(16, number_of_SubPaths);                                    // number_of_SubPaths
    // connection_condition = 1;
    for (size_t PlayItem_id = 0; PlayItem_id < mainStreamInfo.m_index.size(); PlayItem_id++)
    {
        composePlayItem(writer, PlayItem_id, mainStreamInfo.m_index);
        // connection_condition = 6;
    }

    const MPLSStreamInfo& dependStreamInfo = mainStreamInfo;

    for (size_t SubPath_id = 0; SubPath_id < number_of_SubPaths * dependStreamInfo.m_index.size(); SubPath_id++)
    {
        composeSubPath(writer, SubPath_id, dependStreamInfo.m_index, subPath_type);  // pip
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}